

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# footprinttobin.cpp
# Opt level: O2

void __thiscall FootprintToBin::ReadFootprintFileNoChecks(FootprintToBin *this)

{
  Validate *this_00;
  int iVar1;
  int iVar2;
  char *pcVar3;
  
  ReadFirstFootprintLine(this);
  (*(this->super_ValidateFootprint)._vptr_ValidateFootprint[1])(this);
  this_00 = &(this->super_ValidateFootprint).super_Validate;
  while( true ) {
    pcVar3 = fgets(this_00->line_,0x1000,_stdin);
    if (pcVar3 == (char *)0x0) break;
    iVar2 = ValidateFootprint::ScanLine(&this->super_ValidateFootprint);
    if (iVar2 == 4) {
      iVar2 = (this->super_ValidateFootprint).prevEventID_;
      iVar1 = (int)(this->super_ValidateFootprint).initialEveID_;
      (this->super_ValidateFootprint).fr_.event_id = iVar1;
      (this->super_ValidateFootprint).fr_.super_EventRow.areaperil_id =
           (AREAPERIL_INT)(this->super_ValidateFootprint).initialAreaperilID_;
      if (iVar2 != iVar1) {
        (*(this->super_ValidateFootprint)._vptr_ValidateFootprint[2])(this);
        (**(this->super_ValidateFootprint)._vptr_ValidateFootprint)(this);
      }
      (*(this->super_ValidateFootprint)._vptr_ValidateFootprint[1])(this);
    }
    else {
      fprintf(_stderr,"ERROR: Invalid data in line %d:\n%s\n",
              (ulong)(uint)(this->super_ValidateFootprint).super_Validate.lineno_,this_00);
      Validate::PrintErrorMessage(this_00);
    }
  }
  (*(this->super_ValidateFootprint)._vptr_ValidateFootprint[2])(this);
  return;
}

Assistant:

void FootprintToBin::ReadFootprintFileNoChecks() {
/* If user is satisfied that the footprint csv file is sound and therefore does
 * not require any validation checks, this method can be executed instead of
 * ValidateFootprint::ReadFootprintFile(). This method assumes that the methods
 * Validate:SkipHeaderRow() and WriteHeader() have been executed beforehand. */

  ReadFirstFootprintLine();
  WriteBinFootprintFile();

  while (fgets(line_, sizeof(line_), stdin) != 0) {

    if (ScanLine() == 4) {

      fr_.event_id = (int)initialEveID_;
#ifdef AREAPERIL_TYPE_UNSIGNED_LONG_LONG
      fr_.areaperil_id = initialAreaperilID_;
#else
      fr_.areaperil_id = (unsigned int)initialAreaperilID_;
#endif

      if (fr_.event_id != prevEventID_) {

        WriteIdxFootprintFile();
	SetPreviousEventID();

      }

      WriteBinFootprintFile();
      continue;

    }

    fprintf(stderr, "ERROR: Invalid data in line %d:\n%s\n", lineno_, line_);
    PrintErrorMessage();

  }

  WriteIdxFootprintFile();

}